

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O2

JL_STATUS MarshallDictionary(void *Structure,JlMarshallElement *StructDescription,
                            size_t StructDescriptionCount,JlDataObject *DictionaryObject)

{
  JlMarshallElement *Description;
  void *pvVar1;
  JL_STATUS JVar2;
  size_t sVar3;
  ulong uVar4;
  size_t DataSize;
  undefined8 *Input;
  uint uVar5;
  JlDataObject *childDictionary;
  JlDataObject *newListObject;
  JlDataObject *local_50;
  size_t local_48;
  void *local_40;
  JlMarshallElement *local_38;
  
  uVar5 = 0;
  JVar2 = JL_STATUS_SUCCESS;
  local_50 = DictionaryObject;
  local_48 = StructDescriptionCount;
  local_40 = Structure;
  local_38 = StructDescription;
  do {
    pvVar1 = local_40;
    uVar4 = (ulong)uVar5;
    if ((StructDescriptionCount <= uVar4) || (JVar2 != JL_STATUS_SUCCESS)) {
      return JVar2;
    }
    Description = local_38 + uVar4;
    Input = (undefined8 *)(local_38[uVar4].FieldOffset + (long)local_40);
    if (local_38[uVar4].IsArray == true) {
      sVar3 = JlMemoryReadCountValue
                        ((void *)(Description->CountFieldOffset + (long)local_40),
                         Description->CountFieldSize);
      RemoveExistingObjectFromDictionary(DictionaryObject,Description->Name);
      newListObject = (JlDataObject *)0x0;
      if (Description->ArrayFieldSize == 0) {
        Input = (undefined8 *)*Input;
      }
      JVar2 = JlCreateObject(JL_DATA_TYPE_LIST,&newListObject);
      StructDescriptionCount = local_48;
      if (JVar2 == JL_STATUS_SUCCESS) {
        uVar4 = 0;
        JVar2 = JL_STATUS_SUCCESS;
        while ((DictionaryObject = local_50, uVar4 < sVar3 && (JVar2 == JL_STATUS_SUCCESS))) {
          childDictionary = (JlDataObject *)0x0;
          JVar2 = MarshallObject((undefined8 *)(Description->ArrayItemSize * uVar4 + (long)Input),
                                 Description,&childDictionary);
          if (JVar2 == JL_STATUS_SUCCESS) {
            JVar2 = JlAttachObjectToListObject(newListObject,childDictionary);
          }
          uVar4 = uVar4 + 1;
        }
        StructDescriptionCount = local_48;
        if (JVar2 == JL_STATUS_SUCCESS) {
          JVar2 = JlAttachObjectToDictionaryObject(local_50,Description->Name,newListObject);
          StructDescriptionCount = local_48;
        }
      }
    }
    else if (Description->Type == JL_DATA_TYPE_DICTIONARY) {
      childDictionary = (JlDataObject *)0x0;
      JVar2 = JlGetObjectFromDictionaryByKey(DictionaryObject,Description->Name,&childDictionary);
      if (JVar2 == JL_STATUS_NOT_FOUND) {
        JVar2 = JlCreateObject(JL_DATA_TYPE_DICTIONARY,&childDictionary);
        if (JVar2 != JL_STATUS_SUCCESS) goto LAB_0011c84b;
        JVar2 = JlAttachObjectToDictionaryObject(DictionaryObject,Description->Name,childDictionary)
        ;
      }
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = MarshallDictionary(Input,Description->ChildStructDescription,
                                   (ulong)Description->ChildStructDescriptionCount,childDictionary);
      }
    }
    else {
      RemoveExistingObjectFromDictionary(DictionaryObject,Description->Name);
      newListObject = (JlDataObject *)0x0;
      if (Description->IsBase64 == true) {
        if (Description->CountFieldOffset == 0) {
          sVar3 = 0;
        }
        else {
          sVar3 = JlMemoryReadCountValue
                            ((void *)(Description->CountFieldOffset + (long)pvVar1),
                             Description->CountFieldSize);
        }
        DataSize = Description->FieldSize;
        if (DataSize == 0) {
          if (sVar3 == 0) {
            JVar2 = JlCreateObject(JL_DATA_TYPE_STRING,&newListObject);
            goto LAB_0011c834;
          }
          Input = (undefined8 *)*Input;
          DataSize = sVar3;
        }
        childDictionary = (JlDataObject *)0x0;
        JVar2 = JlBase64Encode(Input,DataSize,(char **)&childDictionary);
        if (JVar2 == JL_STATUS_SUCCESS) {
          JVar2 = JlCreateObject(JL_DATA_TYPE_STRING,&newListObject);
          if (JVar2 == JL_STATUS_SUCCESS) {
            JVar2 = JlSetObjectString(newListObject,(char *)childDictionary);
          }
          WjTestLib_Free(childDictionary);
        }
      }
      else {
        JVar2 = MarshallObject(Input,Description,&newListObject);
      }
LAB_0011c834:
      if (JVar2 == JL_STATUS_SUCCESS) {
        JVar2 = JlAttachObjectToDictionaryObject(DictionaryObject,Description->Name,newListObject);
      }
    }
LAB_0011c84b:
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

static
JL_STATUS
    MarshallDictionary
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject*               DictionaryObject
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];
        void const* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);

        if( currentItem->IsArray )
        {
            void const* countFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
            size_t countValue = JlMemoryReadCountValue( countFieldPtr, currentItem->CountFieldSize );

            // Remove the list from the DictionaryObject if it already exists, as we will replace it with our
            // new object for our new list
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new list object
            JlDataObject* newListObject = NULL;
            jlStatus = MarshallList( elementInStruct, countValue, currentItem, &newListObject );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newListObject );
            }
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->Type )
        {
            // Dictionary within this dictionary. We treat this a bit differently from other objects as we
            // will allow existing items in the dictionary to remain if they are already there and not
            // referenced by the Description.

            // Get or create a new dictionary.
            JlDataObject* childDictionary = NULL;
            jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &childDictionary );
            if( JL_STATUS_NOT_FOUND == jlStatus )
            {
                // Create a new dictionary and attach it.
                jlStatus = JlCreateObject( JL_DATA_TYPE_DICTIONARY, &childDictionary );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, childDictionary );
                }
            }

            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // childDictionary is the new dictionary we are going to marshall into.
                jlStatus = MarshallDictionary( elementInStruct, currentItem->ChildStructDescription, currentItem->ChildStructDescriptionCount, childDictionary );
            }
        }
        else
        {
            // Remove the item from the DictionaryObject if it already exists, as we will replace it with our
            // new object
            RemoveExistingObjectFromDictionary( DictionaryObject, currentItem->Name );

            // Marshall new object.
            JlDataObject* newObject = NULL;
            if( currentItem->IsBase64 )
            {
                size_t sizeValue = 0;
                if( currentItem->CountFieldOffset )
                {
                    void const* sizeFieldPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    sizeValue = JlMemoryReadCountValue( sizeFieldPtr, currentItem->CountFieldSize );
                }
                jlStatus = MarshalBinaryData( elementInStruct, sizeValue, currentItem, &newObject );
            }
            else
            {
                jlStatus = MarshallObject( elementInStruct, currentItem, &newObject );
            }
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Attach the object to the dictionary
                jlStatus = JlAttachObjectToDictionaryObject( DictionaryObject, currentItem->Name, newObject );
            }
        }
    }

    return jlStatus;
}